

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O2

Vec_Ptr_t * Amap_LibertyCellOutputs(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Amap_Item_t *pPin;
  Amap_Item_t *pAVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  void **local_38;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 8;
  pVVar2->nSize = 0;
  local_38 = (void **)malloc(0x40);
  pVVar2->pArray = local_38;
  piVar8 = &pCell->Child;
  uVar5 = 0;
  uVar7 = 8;
  while( true ) {
    pPin = Amap_LibertyItem(p,*piVar8);
    if (pPin == (Amap_Item_t *)0x0) break;
    iVar1 = Amap_LibertyCompare(p,pPin->Key,"pin");
    if (iVar1 == 0) {
      pAVar3 = Amap_LibertyPinFunction(p,pPin);
      if (pAVar3 != (Amap_Item_t *)0x0) {
        if (uVar5 == uVar7) {
          uVar6 = uVar7 * 2;
          if ((int)uVar7 < 0x10) {
            uVar6 = 0x10;
          }
          if ((int)uVar7 < (int)uVar6) {
            if (local_38 == (void **)0x0) {
              local_38 = (void **)malloc((ulong)uVar6 << 3);
            }
            else {
              local_38 = (void **)realloc(local_38,(ulong)uVar6 << 3);
            }
            pVVar2->pArray = local_38;
            pVVar2->nCap = uVar6;
            uVar7 = uVar6;
          }
        }
        lVar4 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        pVVar2->nSize = uVar5;
        local_38[lVar4] = pPin;
      }
    }
    piVar8 = &pPin->Next;
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Amap_LibertyCellOutputs( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Vec_Ptr_t * vOutPins;
    vOutPins = Vec_PtrAlloc( 2 );
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            Vec_PtrPush( vOutPins, pPin );
    }
    return vOutPins;
}